

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_send(uv_udp_send_t *req,uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,
                uint addrlen,uv_udp_send_cb send_cb)

{
  void *pvVar1;
  uint in_ECX;
  void *in_RDX;
  void *in_RSI;
  uv_req_t *in_RDI;
  uv_loop_t *in_R8;
  uint in_R9D;
  int err;
  int local_4;
  
  if (in_ECX == 0) {
    __assert_fail("nbufs > 0","src/unix/udp.c",0x18b,
                  "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                 );
  }
  local_4 = uv__udp_maybe_deferred_bind((uv_udp_t *)addr,addrlen);
  if (local_4 == 0) {
    uv__req_init(*(uv_loop_t **)((long)in_RSI + 0x10),in_RDI,UV_UDP_SEND);
    if (0x1c < in_R9D) {
      __assert_fail("addrlen <= sizeof(req->addr)","src/unix/udp.c",0x193,
                    "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                   );
    }
    memcpy(in_RDI + 2,in_R8,(ulong)in_R9D);
    in_RDI[3].active_queue[0] = addr;
    in_RDI[1].data = in_RSI;
    *(uint *)((long)in_RDI[2].active_queue + 0xc) = in_ECX;
    in_RDI[3].data = in_RDI[3].active_queue + 1;
    if (4 < in_ECX) {
      pvVar1 = malloc((ulong)in_ECX << 4);
      in_RDI[3].data = pvVar1;
    }
    if (in_RDI[3].data == (void *)0x0) {
      local_4 = -0xc;
    }
    else {
      memcpy(in_RDI[3].data,in_RDX,(ulong)in_ECX << 4);
      in_RDI[1].active_queue[0] = (void *)((long)in_RSI + 0x88);
      in_RDI[1].active_queue[1] = *(void **)((long)in_RSI + 0x90);
      *(void ***)in_RDI[1].active_queue[1] = in_RDI[1].active_queue;
      *(void ***)((long)in_RSI + 0x90) = in_RDI[1].active_queue;
      uv__io_start(in_R8,(uv__io_t *)CONCAT44(in_R9D,local_4),0);
      if (((*(uint *)((long)in_RSI + 0x30) & 0x4000) == 0) &&
         (*(uint *)((long)in_RSI + 0x30) = *(uint *)((long)in_RSI + 0x30) | 0x4000,
         (*(uint *)((long)in_RSI + 0x30) & 0x2000) != 0)) {
        *(int *)(*(long *)((long)in_RSI + 0x10) + 8) =
             *(int *)(*(long *)((long)in_RSI + 0x10) + 8) + 1;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int uv__udp_send(uv_udp_send_t* req,
                 uv_udp_t* handle,
                 const uv_buf_t bufs[],
                 unsigned int nbufs,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 uv_udp_send_cb send_cb) {
  int err;

  assert(nbufs > 0);

  err = uv__udp_maybe_deferred_bind(handle, addr->sa_family);
  if (err)
    return err;

  uv__req_init(handle->loop, req, UV_UDP_SEND);

  assert(addrlen <= sizeof(req->addr));
  memcpy(&req->addr, addr, addrlen);
  req->send_cb = send_cb;
  req->handle = handle;
  req->nbufs = nbufs;

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL)
    return -ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  QUEUE_INSERT_TAIL(&handle->write_queue, &req->queue);
  uv__io_start(handle->loop, &handle->io_watcher, UV__POLLOUT);
  uv__handle_start(handle);

  return 0;
}